

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O2

string * __thiscall
cmLinkLineComputer::ConvertToOutputForExisting
          (string *__return_storage_ptr__,cmLinkLineComputer *this,string *input)

{
  OutputFormat format;
  
  if (this->ForResponse == false) {
    if (this->UseWatcomQuote == false) {
      format = (uint)this->UseNinjaMulti * 2;
    }
    else {
      format = WATCOMQUOTE;
    }
  }
  else {
    format = RESPONSE;
  }
  cmOutputConverter::ConvertToOutputForExisting
            (__return_storage_ptr__,this->OutputConverter,input,format);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ConvertToOutputForExisting(
  std::string const& input)
{
  cmOutputConverter::OutputFormat shellFormat = cmOutputConverter::SHELL;
  if (this->ForResponse) {
    shellFormat = cmOutputConverter::RESPONSE;
  } else if (this->UseWatcomQuote) {
    shellFormat = cmOutputConverter::WATCOMQUOTE;
  } else if (this->UseNinjaMulti) {
    shellFormat = cmOutputConverter::NINJAMULTI;
  }

  return this->OutputConverter->ConvertToOutputForExisting(input, shellFormat);
}